

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O1

Response * __thiscall
arbiter::http::Curl::post
          (Response *__return_storage_ptr__,Curl *this,string *path,
          vector<char,_std::allocator<char>_> *data,Headers *headers,Query *query,size_t timeout)

{
  pointer pcVar1;
  Response *pRVar2;
  int code;
  undefined8 *puVar3;
  Headers receivedHeaders;
  vector<char,_std::allocator<char>_> local_a8;
  Response *local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_88 = __return_storage_ptr__;
  local_80[0] = local_70;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + path->_M_string_length);
  init(this,(EVP_PKEY_CTX *)local_80);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (timeout != 0) {
    curl_easy_setopt(this->m_curl,0x14,timeout);
  }
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = data;
  puVar3[1] = 0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  curl_easy_setopt(this->m_curl,0x4e2c,anon_unknown_4::putCb);
  curl_easy_setopt(this->m_curl,0x2719,puVar3);
  curl_easy_setopt(this->m_curl,0x4e2b,anon_unknown_4::getCb);
  curl_easy_setopt(this->m_curl,0x2711,&local_a8);
  curl_easy_setopt(this->m_curl,0x2727,this->m_headers);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  curl_easy_setopt(this->m_curl,0x4e6f,anon_unknown_4::headerCb);
  curl_easy_setopt(this->m_curl,0x272d,&local_60);
  curl_easy_setopt(this->m_curl,0x2f,1);
  curl_easy_setopt(this->m_curl,0x75a3,
                   (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start);
  code = perform(this);
  pRVar2 = local_88;
  Response::Response(local_88,code,&local_a8,(Headers *)&local_60);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(puVar3);
  return pRVar2;
}

Assistant:

Response Curl::post(
        std::string path,
        const std::vector<char>& data,
        Headers headers,
        Query query,
        const std::size_t timeout)
{
#ifdef ARBITER_CURL
    init(path, headers, query);
    if (timeout) curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, timeout);

    std::unique_ptr<PutData> putData(new PutData(data));
    std::vector<char> writeData;

    // Register callback function and data pointer to create the request.
    curl_easy_setopt(m_curl, CURLOPT_READFUNCTION, putCb);
    curl_easy_setopt(m_curl, CURLOPT_READDATA, putData.get());

    // Register callback function and data pointer to consume the result.
    curl_easy_setopt(m_curl, CURLOPT_WRITEFUNCTION, getCb);
    curl_easy_setopt(m_curl, CURLOPT_WRITEDATA, &writeData);

    // Insert all headers into the request.
    curl_easy_setopt(m_curl, CURLOPT_HTTPHEADER, m_headers);

    // Set up callback and data pointer for received headers.
    Headers receivedHeaders;
    curl_easy_setopt(m_curl, CURLOPT_HEADERFUNCTION, headerCb);
    curl_easy_setopt(m_curl, CURLOPT_HEADERDATA, &receivedHeaders);

    // Specify that this is a POST request.
    curl_easy_setopt(m_curl, CURLOPT_POST, 1L);

    // Must use this for binary data, otherwise curl will use strlen(), which
    // will likely be incorrect.
    curl_easy_setopt(
            m_curl,
            CURLOPT_INFILESIZE_LARGE,
            static_cast<curl_off_t>(data.size()));

    // Run the command.
    const int httpCode(perform());
    return Response(httpCode, writeData, receivedHeaders);
#else
    throw ArbiterError(fail);
#endif
}